

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O1

Backend * pty_backend_create(Seat *seat,undefined8 param_2,Conf *conf,char **argv,long cmd,
                            uint param_6)

{
  int iVar1;
  _Bool _Var2;
  int iVar3;
  __pid_t _Var4;
  int extraout_EAX;
  Pty *pty;
  long lVar5;
  Conf *pCVar6;
  ssize_t sVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  Backend *pBVar12;
  long lVar13;
  char *pcVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  uint uVar17;
  PtyFd *e;
  ulong uVar18;
  uint uVar19;
  int *__pipedes;
  PtyFd *e_00;
  long *plVar20;
  byte bVar21;
  char *in_stack_00000518;
  undefined8 *in_stack_00000520;
  char *key;
  termios attrs;
  undefined8 auStack_5c8 [163];
  char local_ad;
  uint local_ac;
  char *local_a8;
  Backend *local_a0;
  long local_98;
  char *local_90;
  Seat *local_88;
  Pty *local_80;
  char **local_78;
  termios local_6c;
  
  bVar21 = 0;
  e = (PtyFd *)(ulong)param_6;
  local_88 = seat;
  (*seat->vt->set_trust_status)(seat,false);
  if (single_pty == (Pty *)0x0) {
    pty = (Pty *)safemalloc(1,0x10d0,0);
    memset(pty,0,0x10d0);
    bufchain_init(&pty->output_data);
    pty->master_fd = -1;
    pty->slave_fd = -1;
    pty_stamped_utmp = 0;
  }
  else {
    pty = single_pty;
    if (single_pty->conf != (Conf *)0x0) {
      __assert_fail("pty->conf == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pty.c",
                    0x373,
                    "Backend *pty_backend_create(Seat *, LogContext *, Conf *, char **, const char *, struct ssh_ttymodes, _Bool, const char *, const char *const *)"
                   );
    }
  }
  pty->pipefds[0] = -1;
  pty->pipefds[1] = -1;
  pty->pipefds[2] = -1;
  pty->pipefds[3] = -1;
  pty->pipefds[4] = -1;
  pty->pipefds[5] = -1;
  lVar5 = 0x30;
  do {
    *(undefined4 *)((long)pty->pipefds + lVar5 + -0x18) = 0xffffffff;
    *(Pty **)((long)pty->pipefds + lVar5 + -0x10) = pty;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x60);
  if (pty_signal_pipe[0] < 0) {
    iVar3 = pipe(pty_signal_pipe);
    if (-1 < iVar3) {
      cloexec(pty_signal_pipe[0]);
      cloexec(pty_signal_pipe[1]);
      goto LAB_00111f66;
    }
LAB_0011260e:
    pty_backend_create_cold_5();
    iVar3 = extraout_EAX;
  }
  else {
LAB_00111f66:
    pty->seat = local_88;
    (pty->backend).vt = &pty_backend;
    pCVar6 = conf_copy(conf);
    pty->conf = pCVar6;
    iVar3 = conf_get_int(conf,0x7d);
    pty->term_width = iVar3;
    iVar3 = conf_get_int(conf,0x7e);
    pty->term_height = iVar3;
    if (ptyfds == (tree234 *)0x0) {
      ptyfds = newtree234(ptyfd_compare);
    }
    local_a0 = &pty->backend;
    iVar3 = pty->master_fd;
    local_ac = param_6;
    local_98 = cmd;
    local_78 = argv;
    if ((char)param_6 == '\0') {
      if (iVar3 < 0) {
        pty_open_master(pty);
      }
      if (-1 < pty_utmp_helper_pipe) {
        _Var2 = conf_get_bool(conf,0xc4);
        if (_Var2) {
          local_a8 = (*pty->seat->vt->get_x_display)(pty->seat);
          sVar11 = strlen(local_a8);
          uVar17 = (int)sVar11 + 1;
          e = (PtyFd *)(ulong)uVar17;
          uVar19 = 0;
          do {
            if (uVar17 - uVar19 == 0 || (int)uVar17 < (int)uVar19) break;
            sVar7 = write(pty_utmp_helper_pipe,local_a8 + uVar19,(long)(int)(uVar17 - uVar19));
            iVar3 = (int)sVar7;
            if (iVar3 < 0) {
              pty_backend_create_cold_1();
            }
            else {
              uVar19 = uVar19 + iVar3;
            }
          } while (-1 < iVar3);
        }
        else {
          close(pty_utmp_helper_pipe);
          pty_utmp_helper_pipe = -1;
        }
      }
      iVar3 = pty->master_fd;
      pty->master_i = iVar3;
      pty->master_o = iVar3;
      pty->master_e = -1;
      e_00 = pty->fds;
      pty->fds[0].fd = iVar3;
    }
    else {
      if ((-1 < iVar3) && (close(iVar3), -1 < pty_utmp_helper_pipe)) {
        close(pty_utmp_helper_pipe);
        pty_utmp_helper_pipe = -1;
      }
      __pipedes = pty->pipefds;
      uVar18 = 0xfffffffffffffffe;
      do {
        iVar3 = pipe(__pipedes);
        if (iVar3 < 0) {
          (*local_a0->vt->free)(local_a0);
          return (Backend *)0x0;
        }
        uVar18 = uVar18 + 2;
        __pipedes = __pipedes + 2;
      } while (uVar18 < 4);
      iVar3 = pty->pipefds[1];
      iVar1 = pty->pipefds[2];
      pty->master_i = iVar3;
      pty->fds[0].fd = iVar3;
      pty->master_o = iVar1;
      e = pty->fds + 1;
      pty->fds[1].fd = iVar1;
      iVar3 = pty->pipefds[4];
      pty->master_e = iVar3;
      e_00 = pty->fds + 2;
      pty->fds[2].fd = iVar3;
      add234(ptyfds,pty->fds);
      add234(ptyfds,e);
    }
    param_6 = (uint)e;
    add234(ptyfds,e_00);
    if (pty_setup_sigchld_handler_setup == '\0') {
      putty_signal(0x11,sigchld_handler);
      pty_setup_sigchld_handler_setup = '\x01';
    }
    _Var4 = fork();
    plVar20 = _environ;
    if (_Var4 < 0) {
      pty_backend_create_cold_4();
    }
    else {
      if (_Var4 != 0) {
        pty->child_pid = _Var4;
        pty->child_dead = false;
        pty->finished = false;
        if (0 < pty->slave_fd) {
          close(pty->slave_fd);
        }
        if (ptys_by_pid == (tree234 *)0x0) {
          ptys_by_pid = newtree234(pty_compare_by_pid);
        }
        if (-1 < pty->pipefds[0]) {
          close(pty->pipefds[0]);
          pty->pipefds[0] = -1;
        }
        if (-1 < pty->pipefds[3]) {
          close(pty->pipefds[3]);
          pty->pipefds[3] = -1;
        }
        if (-1 < pty->pipefds[5]) {
          close(pty->pipefds[5]);
          pty->pipefds[5] = -1;
        }
        add234(ptys_by_pid,pty);
        pty_uxsel_setup(pty);
        return local_a0;
      }
      local_80 = pty;
      if ((pty_osx_envrestore_prefix != (char *)0x0) &&
         (pcVar8 = (char *)*_environ, pcVar8 != (char *)0x0)) {
        sVar11 = strlen(pty_osx_envrestore_prefix);
        local_a8 = (char *)(long)(int)sVar11;
        do {
          iVar3 = strncmp(pcVar8,pty_osx_envrestore_prefix,(size_t)local_a8);
          if (iVar3 == 0) {
            local_ad = pcVar8[(long)local_a8];
            sVar11 = strcspn(pcVar8,"=");
            pBVar12 = (Backend *)dupprintf("%.*s",sVar11 & 0xffffffff,pcVar8);
            sVar11 = strcspn(pcVar8,"=");
            pcVar8 = dupstr(pcVar8 + ((sVar11 + 1) - (ulong)(pcVar8[sVar11] == '\0')));
            local_a0 = pBVar12;
            if (local_ad == 'u') {
              unsetenv(local_a8 + (long)pBVar12 + 1);
            }
            else {
              setenv(local_a8 + (long)pBVar12 + 1,pcVar8,1);
            }
            pBVar12 = local_a0;
            unsetenv((char *)local_a0);
            safefree(pBVar12);
            safefree(pcVar8);
            pcVar8 = (char *)*_environ;
            pty = local_80;
            plVar20 = _environ;
          }
          else {
            pcVar8 = (char *)plVar20[1];
            plVar20 = plVar20 + 1;
          }
        } while (pcVar8 != (char *)0x0);
      }
      param_6 = getpid();
      if ((char)local_ac != '\0') {
        pty_backend_create_cold_3();
        lVar5 = local_98;
        goto LAB_001122b4;
      }
    }
    iVar3 = pty_open_slave(pty);
    if (iVar3 < 0) {
      pty_backend_create_cold_2();
      goto LAB_0011260e;
    }
  }
  pty = local_80;
  close(local_80->master_fd);
  noncloexec(iVar3);
  dup2(iVar3,0);
  dup2(iVar3,1);
  dup2(iVar3,2);
  close(iVar3);
  setsid();
  ioctl(0,0x540e,1);
  tcsetpgrp(0,param_6);
  iVar3 = tcgetattr(0,&local_6c);
  lVar5 = local_98;
  if (iVar3 == 0) {
    _Var2 = conf_get_bool(conf,0x48);
    local_6c.c_cc[2] = '\b';
    if (_Var2) {
      local_6c.c_cc[2] = '\x7f';
    }
    _Var2 = (*local_88->vt->is_utf8)(local_88);
    local_6c.c_iflag = (uint)_Var2 << 0xe | local_6c.c_iflag & 0xffffbfff;
    puVar15 = (undefined8 *)&stack0x00000008;
    puVar16 = auStack_5c8;
    for (lVar13 = 0xa1; lVar13 != 0; lVar13 = lVar13 + -1) {
      *puVar16 = *puVar15;
      puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
      puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
    }
    copy_ttymodes_into_termios();
    tcsetattr(0,0,&local_6c);
  }
LAB_001122b4:
  setpgid(param_6,param_6);
  if (((char)local_ac == '\0') && (iVar3 = open(pty->name,1,0), -1 < iVar3)) {
    close(iVar3);
  }
  setpgid(param_6,param_6);
  if (in_stack_00000520 != (undefined8 *)0x0) {
    pcVar8 = (char *)*in_stack_00000520;
    while (pcVar8 != (char *)0x0) {
      in_stack_00000520 = in_stack_00000520 + 1;
      unsetenv(pcVar8);
      pcVar8 = (char *)*in_stack_00000520;
    }
  }
  if ((char)local_ac == '\0') {
    pcVar8 = conf_get_str(conf,0x35);
    pcVar8 = dupprintf("TERM=%s",pcVar8);
    putenv(pcVar8);
  }
  pcVar8 = conf_get_str_strs(conf,0x38,(char *)0x0,&local_90);
  if (pcVar8 != (char *)0x0) {
    do {
      pcVar8 = dupcat_fn(local_90,"=",pcVar8,0);
      putenv(pcVar8);
      pcVar8 = conf_get_str_strs(conf,0x38,local_90,&local_90);
    } while (pcVar8 != (char *)0x0);
  }
  if (in_stack_00000518 != (char *)0x0) {
    chdir(in_stack_00000518);
  }
  putty_signal(2,(_func_void_int *)0x0);
  putty_signal(3,(_func_void_int *)0x0);
  putty_signal(0xd,(_func_void_int *)0x0);
  block_signal(0xd,false);
  if (local_78 == (char **)0x0 && lVar5 == 0) {
    pcVar9 = getenv("SHELL");
    pcVar8 = "/bin/sh";
    if (pcVar9 != (char *)0x0) {
      pcVar8 = pcVar9;
    }
    _Var2 = conf_get_bool(conf,0xc5);
    pcVar9 = pcVar8;
    if (_Var2) {
      pcVar10 = strrchr(pcVar8,0x2f);
      sVar11 = strlen(pcVar8);
      pcVar9 = (char *)safemalloc(sVar11 + 2,1,0);
      pcVar14 = pcVar10 + 1;
      if (pcVar10 == (char *)0x0) {
        pcVar14 = pcVar8;
      }
      sprintf(pcVar9,"-%s",pcVar14);
    }
    execl(pcVar8,pcVar9,0);
  }
  else {
    if (local_78 != (char **)0x0) {
      execvp(*local_78,local_78);
    }
    if ((lVar5 != 0) && (pcVar8 = getenv("SHELL"), pcVar8 != (char *)0x0)) {
      execl(pcVar8,pcVar8,"-c",lVar5,0);
    }
  }
  perror("exec");
  _exit(0x7f);
}

Assistant:

Backend *pty_backend_create(
    Seat *seat, LogContext *logctx, Conf *conf, char **argv, const char *cmd,
    struct ssh_ttymodes ttymodes, bool pipes_instead, const char *dir,
    const char *const *env_vars_to_unset)
{
    int slavefd;
    pid_t pid, pgrp;
#ifndef NOT_X_WINDOWS                  /* for Mac OS X native compilation */
    bool got_windowid;
    long windowid;
#endif
    Pty *pty;
    int i;

    /* No local authentication phase in this protocol */
    seat_set_trust_status(seat, false);

    if (single_pty) {
        pty = single_pty;
        assert(pty->conf == NULL);
    } else {
        pty = new_pty_struct();
        pty->master_fd = pty->slave_fd = -1;
#ifndef OMIT_UTMP
        pty_stamped_utmp = false;
#endif
    }
    for (i = 0; i < 6; i++)
        pty->pipefds[i] = -1;
    for (i = 0; i < 3; i++) {
        pty->fds[i].fd = -1;
        pty->fds[i].pty = pty;
    }

    if (pty_signal_pipe[0] < 0) {
        if (pipe(pty_signal_pipe) < 0) {
            perror("pipe");
            exit(1);
        }
        cloexec(pty_signal_pipe[0]);
        cloexec(pty_signal_pipe[1]);
    }

    pty->seat = seat;
    pty->backend.vt = &pty_backend;

    pty->conf = conf_copy(conf);
    pty->term_width = conf_get_int(conf, CONF_width);
    pty->term_height = conf_get_int(conf, CONF_height);

    if (!ptyfds)
        ptyfds = newtree234(ptyfd_compare);

    if (pipes_instead) {
        if (pty->master_fd >= 0) {
            /* If somehow we've got a pty master already and don't
             * need it, throw it away! */
            close(pty->master_fd);
#ifndef OMIT_UTMP
            if (pty_utmp_helper_pipe >= 0) {
                close(pty_utmp_helper_pipe); /* don't need this either */
                pty_utmp_helper_pipe = -1;
            }
#endif
        }


        for (i = 0; i < 6; i += 2) {
            if (pipe(pty->pipefds + i) < 0) {
                backend_free(&pty->backend);
                return NULL;
            }
        }

        pty->fds[0].fd = pty->master_i = pty->pipefds[1];
        pty->fds[1].fd = pty->master_o = pty->pipefds[2];
        pty->fds[2].fd = pty->master_e = pty->pipefds[4];

        add234(ptyfds, &pty->fds[0]);
        add234(ptyfds, &pty->fds[1]);
        add234(ptyfds, &pty->fds[2]);
    } else {
        if (pty->master_fd < 0)
            pty_open_master(pty);

#ifndef OMIT_UTMP
        /*
         * Stamp utmp (that is, tell the utmp helper process to do so),
         * or not.
         */
        if (pty_utmp_helper_pipe >= 0) {   /* if it's < 0, we can't anyway */
            if (!conf_get_bool(conf, CONF_stamp_utmp)) {
                /* We're not stamping utmp, so just let the child
                 * process die that was waiting to unstamp it later. */
                close(pty_utmp_helper_pipe);
                pty_utmp_helper_pipe = -1;
            } else {
                const char *location = seat_get_x_display(pty->seat);
                int len = strlen(location)+1, pos = 0; /* +1 to include NUL */
                while (pos < len) {
                    int ret = write(pty_utmp_helper_pipe,
                                    location + pos, len - pos);
                    if (ret < 0) {
                        perror("pterm: writing to utmp helper process");
                        close(pty_utmp_helper_pipe); /* arrgh, just give up */
                        pty_utmp_helper_pipe = -1;
                        break;
                    }
                    pos += ret;
                }
            }
        }
#endif

        pty->master_i = pty->master_fd;
        pty->master_o = pty->master_fd;
        pty->master_e = -1;

        pty->fds[0].fd = pty->master_fd;
        add234(ptyfds, &pty->fds[0]);
    }

#ifndef NOT_X_WINDOWS                  /* for Mac OS X native compilation */
    got_windowid = seat_get_windowid(pty->seat, &windowid);
#endif

    /*
     * Set up the signal handler to catch SIGCHLD, if pty_pre_init
     * didn't already do it.
     */
    pty_setup_sigchld_handler();

    /*
     * Fork and execute the command.
     */
    pid = fork();
    if (pid < 0) {
        perror("fork");
        exit(1);
    }

    if (pid == 0) {
        struct termios attrs;

        /*
         * We are the child.
         */

        if (pty_osx_envrestore_prefix) {
            int plen = strlen(pty_osx_envrestore_prefix);
            extern char **environ;
            char **ep;

          restart_osx_env_restore:
            for (ep = environ; *ep; ep++) {
                char *e = *ep;

                if (!strncmp(e, pty_osx_envrestore_prefix, plen)) {
                    bool unset = (e[plen] == 'u');
                    char *pname = dupprintf("%.*s", (int)strcspn(e, "="), e);
                    char *name = pname + plen + 1;
                    char *value = e + strcspn(e, "=");
                    if (*value) value++;
                    value = dupstr(value);
                    if (unset)
                        unsetenv(name);
                    else
                        setenv(name, value, 1);
                    unsetenv(pname);
                    sfree(pname);
                    sfree(value);
                    goto restart_osx_env_restore;
                }
            }
        }

        pgrp = getpid();

        if (pipes_instead) {
            int i;
            dup2(pty->pipefds[0], 0);
            dup2(pty->pipefds[3], 1);
            dup2(pty->pipefds[5], 2);
            for (i = 0; i < 6; i++)
                close(pty->pipefds[i]);

            setsid();
        } else {
            slavefd = pty_open_slave(pty);
            if (slavefd < 0) {
                perror("slave pty: open");
                _exit(1);
            }

            close(pty->master_fd);
            noncloexec(slavefd);
            dup2(slavefd, 0);
            dup2(slavefd, 1);
            dup2(slavefd, 2);
            close(slavefd);
            setsid();
#ifdef TIOCSCTTY
            ioctl(0, TIOCSCTTY, 1);
#endif
            tcsetpgrp(0, pgrp);

            /*
             * Set up configuration-dependent termios settings on the new
             * pty. Linux would have let us do this on the pty master
             * before we forked, but that fails on OS X, so we do it here
             * instead.
             */
            if (tcgetattr(0, &attrs) == 0) {
                /*
                 * Set the backspace character to be whichever of ^H and
                 * ^? is specified by bksp_is_delete.
                 */
                attrs.c_cc[VERASE] = conf_get_bool(conf, CONF_bksp_is_delete)
                    ? '\177' : '\010';

                /*
                 * Set the IUTF8 bit iff the character set is UTF-8.
                 */
#ifdef IUTF8
                if (seat_is_utf8(seat))
                    attrs.c_iflag |= IUTF8;
                else
                    attrs.c_iflag &= ~IUTF8;
#endif

                copy_ttymodes_into_termios(&attrs, ttymodes);

                tcsetattr(0, TCSANOW, &attrs);
            }
        }

        setpgid(pgrp, pgrp);
        if (!pipes_instead) {
            int ptyfd = open(pty->name, O_WRONLY, 0);
            if (ptyfd >= 0)
                close(ptyfd);
        }
        setpgid(pgrp, pgrp);

        if (env_vars_to_unset)
            for (const char *const *p = env_vars_to_unset; *p; p++)
                unsetenv(*p);

        if (!pipes_instead) {
            char *term_env_var = dupprintf("TERM=%s",
                                           conf_get_str(conf, CONF_termtype));
            putenv(term_env_var);
            /* We mustn't free term_env_var, as putenv links it into the
             * environment in place.
             */
        }
#ifndef NOT_X_WINDOWS                  /* for Mac OS X native compilation */
        if (got_windowid) {
            char *windowid_env_var = dupprintf("WINDOWID=%ld", windowid);
            putenv(windowid_env_var);
            /* We mustn't free windowid_env_var, as putenv links it into the
             * environment in place.
             */
        }
        {
            /*
             * In case we were invoked with a --display argument that
             * doesn't match DISPLAY in our actual environment, we
             * should set DISPLAY for processes running inside the
             * terminal to match the display the terminal itself is
             * on.
             */
            const char *x_display = seat_get_x_display(pty->seat);
            if (x_display) {
                char *x_display_env_var = dupprintf("DISPLAY=%s", x_display);
                putenv(x_display_env_var);
                /* As above, we don't free this. */
            } else {
                unsetenv("DISPLAY");
            }
        }
#endif
        {
            char *key, *val;

            for (val = conf_get_str_strs(conf, CONF_environmt, NULL, &key);
                 val != NULL;
                 val = conf_get_str_strs(conf, CONF_environmt, key, &key)) {
                char *varval = dupcat(key, "=", val);
                putenv(varval);
                /*
                 * We must not free varval, since putenv links it
                 * into the environment _in place_. Weird, but
                 * there we go. Memory usage will be rationalised
                 * as soon as we exec anyway.
                 */
            }
        }

        if (dir) {
            if (chdir(dir) < 0) {
                /* Ignore the error - nothing we can sensibly do about it,
                 * and our existing cwd is as good a fallback as any. */
            }
        }

        /*
         * SIGINT, SIGQUIT and SIGPIPE may have been set to ignored by
         * our parent, particularly by things like sh -c 'pterm &' and
         * some window or session managers. SIGPIPE was also
         * (potentially) blocked by us during startup. Reverse all
         * this for our child process.
         */
        putty_signal(SIGINT, SIG_DFL);
        putty_signal(SIGQUIT, SIG_DFL);
        putty_signal(SIGPIPE, SIG_DFL);
        block_signal(SIGPIPE, false);
        if (argv || cmd) {
            /*
             * If we were given a separated argument list, try to exec
             * it.
             */
            if (argv) {
                execvp(argv[0], argv);
            }
            /*
             * Otherwise, if we were given a single command string,
             * try passing that to $SHELL -c.
             *
             * In the case of pterm, this system of fallbacks arranges
             * that we can _either_ follow 'pterm -e' with a list of
             * argv elements to be fed directly to exec, _or_ with a
             * single argument containing a command to be parsed by a
             * shell (but, in cases of doubt, the former is more
             * reliable). We arrange this by setting argv to the full
             * argument list, and also setting cmd to the single
             * element of argv if it's a length-1 list.
             *
             * A quick survey of other terminal emulators' -e options
             * (as of Debian squeeze) suggests that:
             *
             *  - xterm supports both modes, more or less like this
             *  - gnome-terminal will only accept a one-string shell command
             *  - Eterm, kterm and rxvt will only accept a list of
             *    argv elements (as did older versions of pterm).
             *
             * It therefore seems important to support both usage
             * modes in order to be a drop-in replacement for either
             * xterm or gnome-terminal, and hence for anyone's
             * plausible uses of the Debian-style alias
             * 'x-terminal-emulator'.
             *
             * In other use cases, a caller can set only one of argv
             * and cmd to get a fixed handling of the input.
             */
            if (cmd) {
                char *shell = getenv("SHELL");
                if (shell)
                    execl(shell, shell, "-c", cmd, (void *)NULL);
            }
        } else {
            const char *shell = getenv("SHELL");
            if (!shell)
                shell = "/bin/sh";
            char *shellname;
            if (conf_get_bool(conf, CONF_login_shell)) {
                const char *p = strrchr(shell, '/');
                shellname = snewn(2+strlen(shell), char);
                p = p ? p+1 : shell;
                sprintf(shellname, "-%s", p);
            } else
                shellname = (char *)shell;
            execl(shell, shellname, (void *)NULL);
        }

        /*
         * If we're here, exec has gone badly foom.
         */
        perror("exec");
        _exit(127);
    } else {
        pty->child_pid = pid;
        pty->child_dead = false;
        pty->finished = false;
        if (pty->slave_fd > 0)
            close(pty->slave_fd);
        if (!ptys_by_pid)
            ptys_by_pid = newtree234(pty_compare_by_pid);
        if (pty->pipefds[0] >= 0) {
            close(pty->pipefds[0]);
            pty->pipefds[0] = -1;
        }
        if (pty->pipefds[3] >= 0) {
            close(pty->pipefds[3]);
            pty->pipefds[3] = -1;
        }
        if (pty->pipefds[5] >= 0) {
            close(pty->pipefds[5]);
            pty->pipefds[5] = -1;
        }
        add234(ptys_by_pid, pty);
    }

    pty_uxsel_setup(pty);

    return &pty->backend;
}